

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

ON_XMLVariant * __thiscall
ON_RenderContent::GetParameter
          (ON_XMLVariant *__return_storage_ptr__,ON_RenderContent *this,wchar_t *name)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  recursive_mutex *__mutex;
  ON_XMLParametersV8 p;
  ON_XMLParameters local_30;
  
  __mutex = &this->_private->m_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
    ::ON_XMLVariant::SetNull(__return_storage_ptr__);
    pOVar2 = ON_XMLNode::GetNamedChild(&this->_private->m_node,L"parameters-v8");
    if (pOVar2 == (ON_XMLNode *)0x0) {
      pOVar2 = ON_XMLNode::GetNamedChild(&this->_private->m_node,L"parameters");
      if (pOVar2 != (ON_XMLNode *)0x0) {
        ON_XMLParameters::ON_XMLParameters(&local_30,pOVar2);
        ON_XMLParameters::GetParam(&local_30,name,__return_storage_ptr__);
        ON_XMLParameters::~ON_XMLParameters(&local_30);
      }
    }
    else {
      ON_XMLParametersV8::ON_XMLParametersV8((ON_XMLParametersV8 *)&local_30,pOVar2);
      ON_XMLParametersV8::GetParam((ON_XMLParametersV8 *)&local_30,name,__return_storage_ptr__);
      ON_XMLParameters::~ON_XMLParameters(&local_30);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ON_XMLVariant ON_RenderContent::GetParameter(const wchar_t* name) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_XMLVariant value;
  value.SetNull();

  // Try to get the new V8 parameter section.
  const ON_XMLNode* node = _private->m_node.GetNamedChild(ON_RENDER_CONTENT_PARAMETERS_V8);
  if (nullptr != node)
  {
    // Got it, so use the new ON_XMLParametersV8 to get the parameter's value.
    ON_XMLParametersV8 p(*node);
    p.GetParam(name, value);
  }
  else
  {
    // Either no V8 section was found or the parameter isn't there yet.
    // Try to get the legacy parameter section. This should not fail.
    node = _private->m_node.GetNamedChild(ON_RENDER_CONTENT_PARAMETERS);
    if (nullptr != node)
    {
      // Got it, so use the legacy ON_XMLParameters to get the parameter's value.
      ON_XMLParameters p(*node);
      p.GetParam(name, value);
    }
  }

  return value;
}